

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

CURLcode Curl_mime_prepare_headers
                   (curl_mimepart *part,char *contenttype,char *disposition,mimestrategy strategy)

{
  curl_slist **slp;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  curl_slist *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  curl_mimepart *part_00;
  void *local_48;
  
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = (curl_slist *)0x0;
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    (part->state).state = MIMESTATE_CURLHEADERS;
    (part->state).ptr = (void *)0x0;
    (part->state).offset = 0;
  }
  pcVar14 = part->mimetype;
  if (pcVar14 == (char *)0x0) {
    pcVar11 = part->userheaders;
    if (pcVar11 == (curl_slist *)0x0) {
      pcVar14 = (char *)0x0;
    }
    else {
      do {
        pcVar14 = match_header(pcVar11,"Content-Type",0xc);
        if (pcVar14 != (char *)0x0) break;
        pcVar11 = pcVar11->next;
      } while (pcVar11 != (curl_slist *)0x0);
    }
  }
  if (pcVar14 != (char *)0x0) {
    contenttype = pcVar14;
  }
  if (contenttype == (char *)0x0) {
    if (part->kind == MIMEKIND_MULTIPART) {
      contenttype = "multipart/mixed";
    }
    else if (part->kind == MIMEKIND_FILE) {
      contenttype = Curl_mime_contenttype(part->filename);
      if (contenttype == (char *)0x0) {
        contenttype = Curl_mime_contenttype(part->data);
      }
      if ((contenttype == (char *)0x0) &&
         (contenttype = "application/octet-stream", part->filename == (char *)0x0)) {
        contenttype = (char *)0x0;
      }
    }
    else {
      contenttype = Curl_mime_contenttype(part->filename);
    }
  }
  if (part->kind == MIMEKIND_MULTIPART) {
    local_48 = part->arg;
    pcVar14 = (char *)((long)local_48 + 0x20);
    if (local_48 == (void *)0x0) {
      pcVar14 = (char *)0x0;
    }
  }
  else {
    if ((((pcVar14 == (char *)0x0) && (contenttype != (char *)0x0)) &&
        (iVar4 = Curl_strncasecompare(contenttype,"text/plain",10), iVar4 != 0)) &&
       ((((ulong)(byte)contenttype[10] < 0x3c &&
         ((0x800000100002601U >> ((ulong)(byte)contenttype[10] & 0x3f) & 1) != 0)) &&
        ((strategy == MIMESTRATEGY_MAIL || (part->filename == (char *)0x0)))))) {
      contenttype = (char *)0x0;
    }
    local_48 = (void *)0x0;
    pcVar14 = (char *)0x0;
  }
  slp = &part->curlheaders;
  pcVar11 = part->userheaders;
  if (pcVar11 == (curl_slist *)0x0) {
LAB_005a4821:
    if (disposition == (char *)0x0) {
      if (((part->filename == (char *)0x0) && (part->name == (char *)0x0)) &&
         ((contenttype == (char *)0x0 ||
          (iVar4 = Curl_strncasecompare(contenttype,"multipart/",10), iVar4 != 0)))) {
        disposition = (char *)0x0;
      }
      else {
        disposition = "attachment";
      }
    }
    CVar5 = CURLE_OK;
    if (disposition == (char *)0x0) {
      disposition = (char *)0x0;
    }
    else {
      iVar4 = curl_strequal(disposition,"attachment");
      if (((iVar4 != 0) && (part->name == (char *)0x0)) && (part->filename == (char *)0x0)) {
        disposition = (char *)0x0;
      }
    }
    if (disposition != (char *)0x0) {
      CVar5 = CURLE_OK;
      bVar1 = true;
      if (part->name == (char *)0x0) {
LAB_005a494b:
        pcVar7 = (char *)0x0;
      }
      else {
        pcVar7 = escape_string(part->easy,part->name,strategy);
        if (pcVar7 == (char *)0x0) {
          CVar5 = CURLE_OUT_OF_MEMORY;
          bVar1 = false;
          goto LAB_005a494b;
        }
      }
      pcVar8 = (char *)0x0;
      if (bVar1) {
        if (part->filename == (char *)0x0) {
          CVar5 = CURLE_OK;
        }
        else {
          pcVar8 = escape_string(part->easy,part->filename,strategy);
          CVar5 = CURLE_OUT_OF_MEMORY;
          if (pcVar8 != (char *)0x0) {
            CVar5 = CURLE_OK;
          }
        }
      }
      if (CVar5 == CURLE_OK) {
        pcVar9 = "; name=\"";
        pcVar12 = pcVar7;
        if (pcVar7 == (char *)0x0) {
          pcVar9 = "";
          pcVar12 = "";
        }
        pcVar2 = "\n\t\t\t\"";
        pcVar3 = "\n\t\t\t\"";
        if (pcVar7 == (char *)0x0) {
          pcVar3 = "PK\x01\x02";
        }
        pcVar13 = "; filename=\"";
        pcVar10 = pcVar8;
        if (pcVar8 == (char *)0x0) {
          pcVar13 = "";
          pcVar10 = "";
          pcVar2 = "PK\x01\x02";
        }
        CVar5 = Curl_mime_add_header
                          (slp,"Content-Disposition: %s%s%s%s%s%s%s",disposition,pcVar9,pcVar12,
                           pcVar3 + 4,pcVar13,pcVar10,pcVar2 + 4);
      }
      (*Curl_cfree)(pcVar7);
      (*Curl_cfree)(pcVar8);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
    }
  }
  else {
    do {
      pcVar7 = match_header(pcVar11,"Content-Disposition",0x13);
      if (pcVar7 != (char *)0x0) break;
      pcVar11 = pcVar11->next;
    } while (pcVar11 != (curl_slist *)0x0);
    CVar5 = CURLE_OK;
    if (pcVar7 == (char *)0x0) goto LAB_005a4821;
  }
  if (contenttype != (char *)0x0) {
    pcVar7 = "; boundary=";
    if (pcVar14 == (char *)0x0) {
      pcVar7 = "";
      pcVar14 = "";
    }
    CVar5 = CURLE_OK;
    CVar6 = Curl_mime_add_header(slp,"Content-Type: %s%s%s",contenttype,pcVar7,pcVar14);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
  }
  pcVar11 = part->userheaders;
  if (pcVar11 != (curl_slist *)0x0) {
    do {
      pcVar14 = match_header(pcVar11,"Content-Transfer-Encoding",0x19);
      if (pcVar14 != (char *)0x0) break;
      pcVar11 = pcVar11->next;
    } while (pcVar11 != (curl_slist *)0x0);
    if (pcVar14 != (char *)0x0) goto LAB_005a4b0c;
  }
  if (part->encoder == (mime_encoder *)0x0) {
    pcVar14 = (char *)0x0;
    if (((strategy == MIMESTRATEGY_MAIL) && (contenttype != (char *)0x0)) &&
       (pcVar14 = (char *)0x0, part->kind != MIMEKIND_MULTIPART)) {
      pcVar14 = "8bit";
    }
  }
  else {
    pcVar14 = part->encoder->name;
  }
  if (pcVar14 != (char *)0x0) {
    CVar5 = CURLE_OK;
    CVar6 = Curl_mime_add_header(slp,"Content-Transfer-Encoding: %s");
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
  }
LAB_005a4b0c:
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    pcVar11 = part->curlheaders;
    (part->state).state = MIMESTATE_CURLHEADERS;
    (part->state).ptr = pcVar11;
    (part->state).offset = 0;
  }
  if ((local_48 != (void *)0x0) && (part->kind == MIMEKIND_MULTIPART)) {
    if ((contenttype == (char *)0x0) ||
       (((iVar4 = Curl_strncasecompare(contenttype,"multipart/form-data",0x13), iVar4 == 0 ||
         (0x3b < (ulong)(byte)contenttype[0x13])) ||
        ((0x800000100002601U >> ((ulong)(byte)contenttype[0x13] & 0x3f) & 1) == 0)))) {
      pcVar14 = (char *)0x0;
    }
    else {
      pcVar14 = "form-data";
    }
    part_00 = *(curl_mimepart **)((long)local_48 + 0x10);
    if (part_00 != (curl_mimepart *)0x0) {
      do {
        CVar5 = Curl_mime_prepare_headers(part_00,(char *)0x0,pcVar14,strategy);
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
        part_00 = part_00->nextpart;
      } while (part_00 != (curl_mimepart *)0x0);
      CVar5 = CURLE_OK;
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_mime_prepare_headers(curl_mimepart *part,
                                   const char *contenttype,
                                   const char *disposition,
                                   enum mimestrategy strategy)
{
  curl_mime *mime = NULL;
  const char *boundary = NULL;
  char *customct;
  const char *cte = NULL;
  CURLcode ret = CURLE_OK;

  /* Get rid of previously prepared headers. */
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = NULL;

  /* Be sure we won't access old headers later. */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, NULL);

  /* Check if content type is specified. */
  customct = part->mimetype;
  if(!customct)
    customct = search_header(part->userheaders, STRCONST("Content-Type"));
  if(customct)
    contenttype = customct;

  /* If content type is not specified, try to determine it. */
  if(!contenttype) {
    switch(part->kind) {
    case MIMEKIND_MULTIPART:
      contenttype = MULTIPART_CONTENTTYPE_DEFAULT;
      break;
    case MIMEKIND_FILE:
      contenttype = Curl_mime_contenttype(part->filename);
      if(!contenttype)
        contenttype = Curl_mime_contenttype(part->data);
      if(!contenttype && part->filename)
        contenttype = FILE_CONTENTTYPE_DEFAULT;
      break;
    default:
      contenttype = Curl_mime_contenttype(part->filename);
      break;
    }
  }

  if(part->kind == MIMEKIND_MULTIPART) {
    mime = (curl_mime *) part->arg;
    if(mime)
      boundary = mime->boundary;
  }
  else if(contenttype && !customct &&
          content_type_match(contenttype, STRCONST("text/plain")))
    if(strategy == MIMESTRATEGY_MAIL || !part->filename)
      contenttype = NULL;

  /* Issue content-disposition header only if not already set by caller. */
  if(!search_header(part->userheaders, STRCONST("Content-Disposition"))) {
    if(!disposition)
      if(part->filename || part->name ||
        (contenttype && !strncasecompare(contenttype, "multipart/", 10)))
          disposition = DISPOSITION_DEFAULT;
    if(disposition && curl_strequal(disposition, "attachment") &&
     !part->name && !part->filename)
      disposition = NULL;
    if(disposition) {
      char *name = NULL;
      char *filename = NULL;

      if(part->name) {
        name = escape_string(part->easy, part->name, strategy);
        if(!name)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret && part->filename) {
        filename = escape_string(part->easy, part->filename, strategy);
        if(!filename)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret)
        ret = Curl_mime_add_header(&part->curlheaders,
                                   "Content-Disposition: %s%s%s%s%s%s%s",
                                   disposition,
                                   name? "; name=\"": "",
                                   name? name: "",
                                   name? "\"": "",
                                   filename? "; filename=\"": "",
                                   filename? filename: "",
                                   filename? "\"": "");
      Curl_safefree(name);
      Curl_safefree(filename);
      if(ret)
        return ret;
      }
    }

  /* Issue Content-Type header. */
  if(contenttype) {
    ret = add_content_type(&part->curlheaders, contenttype, boundary);
    if(ret)
      return ret;
  }

  /* Content-Transfer-Encoding header. */
  if(!search_header(part->userheaders,
                    STRCONST("Content-Transfer-Encoding"))) {
    if(part->encoder)
      cte = part->encoder->name;
    else if(contenttype && strategy == MIMESTRATEGY_MAIL &&
     part->kind != MIMEKIND_MULTIPART)
      cte = "8bit";
    if(cte) {
      ret = Curl_mime_add_header(&part->curlheaders,
                                 "Content-Transfer-Encoding: %s", cte);
      if(ret)
        return ret;
    }
  }

  /* If we were reading curl-generated headers, restart with new ones (this
     should not occur). */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, part->curlheaders);

  /* Process subparts. */
  if(part->kind == MIMEKIND_MULTIPART && mime) {
    curl_mimepart *subpart;

    disposition = NULL;
    if(content_type_match(contenttype, STRCONST("multipart/form-data")))
      disposition = "form-data";
    for(subpart = mime->firstpart; subpart; subpart = subpart->nextpart) {
      ret = Curl_mime_prepare_headers(subpart, NULL, disposition, strategy);
      if(ret)
        return ret;
    }
  }
  return ret;
}